

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngunknown.c
# Opt level: O0

int findb(png_byte *name)

{
  int local_14;
  int i;
  png_byte *name_local;
  
  local_14 = 0x19;
  do {
    local_14 = local_14 + -1;
    if (local_14 < 0) {
      return local_14;
    }
  } while (*(int *)chunk_info[local_14].name != *(int *)name);
  return local_14;
}

Assistant:

static int
findb(const png_byte *name)
{
   int i = NINFO;
   while (--i >= 0)
   {
      if (memcmp(chunk_info[i].name, name, 4) == 0)
         break;
   }

   return i;
}